

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrSort(Vec_Ptr_t *p,_func_int_varargs *Vec_PtrSortCompare)

{
  _func_int_varargs *Vec_PtrSortCompare_local;
  Vec_Ptr_t *p_local;
  
  if (1 < p->nSize) {
    if (Vec_PtrSortCompare == (_func_int_varargs *)0x0) {
      qsort(p->pArray,(long)p->nSize,8,Vec_PtrSortComparePtr);
    }
    else {
      qsort(p->pArray,(long)p->nSize,8,(__compar_fn_t)Vec_PtrSortCompare);
    }
  }
  return;
}

Assistant:

static void Vec_PtrSort( Vec_Ptr_t * p, int (*Vec_PtrSortCompare)() )
{
    if ( p->nSize < 2 )
        return;
    if ( Vec_PtrSortCompare == NULL )
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(void *), 
                (int (*)(const void *, const void *)) Vec_PtrSortComparePtr );
    else
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(void *), 
                (int (*)(const void *, const void *)) Vec_PtrSortCompare );
}